

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KuhnAlgorithm.cpp
# Opt level: O3

bool __thiscall BoxNesting::KuhnAlgorithm::kuhn(KuhnAlgorithm *this,int16_t vertex)

{
  short sVar1;
  _Bit_type *p_Var2;
  pointer pvVar3;
  bool bVar4;
  short sVar5;
  ulong uVar6;
  pointer psVar7;
  ulong uVar8;
  undefined6 in_register_00000032;
  long lVar9;
  ulong uVar10;
  
  uVar10 = (ulong)(int)CONCAT62(in_register_00000032,vertex);
  sVar5 = vertex + 0x3f;
  if (-1 < vertex) {
    sVar5 = vertex;
  }
  sVar5 = (short)((uint)(int)sVar5 >> 6);
  p_Var2 = (this->used).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p;
  uVar8 = (ulong)((uVar10 & 0x800000000000003f) < 0x8000000000000001);
  uVar6 = p_Var2[(long)sVar5 + uVar8 + 0xffffffffffffffff];
  if ((uVar6 >> (uVar10 & 0x3f) & 1) == 0) {
    p_Var2[(long)sVar5 + uVar8 + 0xffffffffffffffff] = uVar6 | 1L << ((byte)vertex & 0x3f);
    pvVar3 = (this->graph).
             super__Vector_base<std::vector<short,_std::allocator<short>_>,_std::allocator<std::vector<short,_std::allocator<short>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar9 = (long)*(pointer *)
                   ((long)&pvVar3[uVar10].super__Vector_base<short,_std::allocator<short>_>._M_impl
                   + 8) -
            *(long *)&pvVar3[uVar10].super__Vector_base<short,_std::allocator<short>_>._M_impl;
    if (lVar9 != 0) {
      sVar5 = 1;
      uVar6 = 0;
      do {
        psVar7 = (this->pairsRight).super__Vector_base<short,_std::allocator<short>_>._M_impl.
                 super__Vector_impl_data._M_start;
        sVar1 = *(short *)(*(long *)&(this->graph).
                                     super__Vector_base<std::vector<short,_std::allocator<short>_>,_std::allocator<std::vector<short,_std::allocator<short>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start[uVar10].
                                     super__Vector_base<short,_std::allocator<short>_>._M_impl +
                          uVar6 * 2);
        if (psVar7[sVar1] == -1) {
LAB_00114326:
          psVar7[sVar1] = vertex;
          (this->pairsLeft).super__Vector_base<short,_std::allocator<short>_>._M_impl.
          super__Vector_impl_data._M_start[uVar10] = sVar1;
          return true;
        }
        bVar4 = kuhn(this,psVar7[sVar1]);
        if (bVar4) {
          psVar7 = (this->pairsRight).super__Vector_base<short,_std::allocator<short>_>._M_impl.
                   super__Vector_impl_data._M_start;
          goto LAB_00114326;
        }
        uVar6 = (ulong)sVar5;
        sVar5 = sVar5 + 1;
      } while (uVar6 < (ulong)(lVar9 >> 1));
    }
  }
  return false;
}

Assistant:

bool KuhnAlgorithm::kuhn(int16_t vertex) const
{
	if (this->used[vertex]) {
		return false;
	}
	this->used[vertex] = true;

	auto sz = this->graph[vertex].size();
	for (int16_t i = 0; i < sz; ++i) {
		auto to = this->graph[vertex][i];
		if (this->pairsRight[to] == -1 || kuhn(this->pairsRight[to])) {
			this->pairsRight[to] = vertex;
			this->pairsLeft[vertex] = to;
			return true;
		}
	}
	return false;
}